

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void gpu_mapping_register_write(gpu_mapping *mapping,uint64_t address,uint32_t len,void *data)

{
  gpu_object *pgVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  
  pgVar1 = mapping->object;
  lVar3 = (address - mapping->address) + mapping->object_offset;
  if (pgVar1->length < lVar3 + (ulong)len) {
    fprintf(_stdout,
            "ERROR: object 0x%x:0x%x is too small (%ld) for write starting at %ld and length %d\n",
            (ulong)pgVar1->cid,(ulong)pgVar1->handle,pgVar1->length,lVar3,
            CONCAT44((int)((ulong)in_RAX >> 0x20),len));
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
  }
  else {
    memcpy(pgVar1->data + lVar3,data,(ulong)len);
    iVar2 = regions_add_range(&pgVar1->written_regions,(uint32_t)lVar3,len);
    if (iVar2 != 0) {
      return;
    }
  }
  demmt_abort();
}

Assistant:

void gpu_mapping_register_write(struct gpu_mapping *mapping, uint64_t address, uint32_t len, const void *data)
{
	struct gpu_object *obj = mapping->object;
	uint64_t gpu_object_offset = address - mapping->address + mapping->object_offset;

	if (obj->length < gpu_object_offset + len)
	{
		mmt_error("object 0x%x:0x%x is too small (%" PRId64 ") for write starting at %" PRId64 " and length %d\n",
				obj->cid, obj->handle, obj->length, gpu_object_offset, len);
		demmt_abort();
	}

	memcpy(obj->data + gpu_object_offset, data, len);

	if (!regions_add_range(&obj->written_regions, gpu_object_offset, len))
		demmt_abort();
}